

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O3

vector<long_long,_std::allocator<long_long>_> *
cppqc::shrinkIntegral<long_long>
          (vector<long_long,_std::allocator<long_long>_> *__return_storage_ptr__,longlong x)

{
  iterator __position;
  long lVar1;
  ulong uVar2;
  longlong local_28;
  
  (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar1 = x;
  if (x < 0) {
    if (x == -0x8000000000000000) {
      local_28 = 0x7fffffffffffffff;
      std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                (__return_storage_ptr__,(iterator)0x0,&local_28);
    }
    else {
      local_28 = -x;
      std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                (__return_storage_ptr__,(iterator)0x0,&local_28);
    }
  }
  else if (x == 0) {
    return __return_storage_ptr__;
  }
  do {
    local_28 = x - lVar1;
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                (__return_storage_ptr__,__position,&local_28);
    }
    else {
      *__position._M_current = local_28;
      (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    uVar2 = lVar1 + 1;
    lVar1 = lVar1 / 2;
  } while (2 < uVar2);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Integral> shrinkIntegral(Integral x) {
  std::vector<Integral> ret;
  if (std::numeric_limits<Integral>::is_signed && x < 0) {
    if (x == std::numeric_limits<Integral>::min()) {
      ret.push_back(std::numeric_limits<Integral>::max());
    } else {
      assert(-x > 0);
      ret.push_back(-x);
    }
  }

  for (Integral n = x; n != 0; n /= 2)
    ret.push_back(x - n);
  return ret;
}